

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_70(QPDF *pdf,char *arg2)

{
  allocator<char> local_49;
  string local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30 [3];
  QPDFObjectHandle trailer;
  
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/S1",&local_49);
  QPDFObjectHandle::getKey(local_48);
  QPDFObjectHandle::setFilterOnWrite(SUB81(local_48,0));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/S2",&local_49);
  QPDFObjectHandle::getKey(local_48);
  QPDFObjectHandle::setFilterOnWrite(SUB81(local_48,0));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__cxx11::string::~string((string *)&w);
  QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(&w,0));
  QPDFWriter::setDecodeLevel((qpdf_stream_decode_level_e)&w);
  QPDFWriter::write();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trailer.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void
test_70(QPDF& pdf, char const* arg2)
{
    auto trailer = pdf.getTrailer();
    trailer.getKey("/S1").setFilterOnWrite(false);
    trailer.getKey("/S2").setFilterOnWrite(false);
    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setDecodeLevel(qpdf_dl_specialized);
    w.write();
}